

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::CallFinder::~CallFinder(CallFinder *this)

{
  CallFinder *this_local;
  
  std::
  vector<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ::~vector(&this->infos);
  PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
  ::~PostWalker(&this->
                 super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
               );
  return;
}

Assistant:

void visitCall(Call* curr) {
    // Add the call as not having a drop, and update the drop later if we are.
    infos.push_back(CallInfo{curr, nullptr});
  }